

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

UBool __thiscall icu_63::NFRuleSet::operator==(NFRuleSet *this,NFRuleSet *rhs)

{
  ushort uVar1;
  short sVar2;
  NFRule *rhs_00;
  UBool UVar3;
  int len;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  
  if (((this->rules).fCount == (rhs->rules).fCount) &&
     (this->fIsFractionRuleSet == rhs->fIsFractionRuleSet)) {
    uVar1 = (this->name).fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        len = (this->name).fUnion.fFields.fLength;
      }
      else {
        len = (int)(short)uVar1 >> 5;
      }
      sVar2 = (rhs->name).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar4 = (rhs->name).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)sVar2 >> 5;
      }
      bVar6 = false;
      if ((((int)sVar2 & 1U) == 0) && (bVar6 = false, len == iVar4)) {
        UVar3 = UnicodeString::doEquals(&this->name,&rhs->name,len);
        bVar6 = UVar3 != '\0';
      }
    }
    else {
      bVar6 = (bool)(*(byte *)&(rhs->name).fUnion & 1);
    }
    if (bVar6 != false) {
      uVar5 = 0;
      bVar6 = false;
      do {
        rhs_00 = rhs->nonNumericalRules[uVar5];
        if (this->nonNumericalRules[uVar5] == (NFRule *)0x0) {
          if (rhs_00 != (NFRule *)0x0) {
LAB_0024d53a:
            if (!bVar6) {
              return '\0';
            }
            break;
          }
        }
        else if ((rhs_00 == (NFRule *)0x0) ||
                (UVar3 = NFRule::operator==(this->nonNumericalRules[uVar5],rhs_00), UVar3 == '\0'))
        goto LAB_0024d53a;
        bVar6 = 4 < uVar5;
        uVar5 = uVar5 + 1;
      } while (uVar5 != 6);
      bVar6 = (this->rules).fCount == 0;
      if (bVar6) {
        return bVar6;
      }
      UVar3 = NFRule::operator==(*(this->rules).fStuff,*(rhs->rules).fStuff);
      if (UVar3 != '\0') {
        uVar5 = 1;
        do {
          bVar6 = (this->rules).fCount <= uVar5;
          if (bVar6) {
            return bVar6;
          }
          UVar3 = NFRule::operator==((this->rules).fStuff[uVar5],(rhs->rules).fStuff[uVar5]);
          uVar5 = uVar5 + 1;
        } while (UVar3 != '\0');
        return bVar6;
      }
      return bVar6;
    }
  }
  return '\0';
}

Assistant:

static int64_t
util_lcm(int64_t x, int64_t y)
{
    // binary gcd algorithm from Knuth, "The Art of Computer Programming,"
    // vol. 2, 1st ed., pp. 298-299
    int64_t x1 = x;
    int64_t y1 = y;

    int p2 = 0;
    while ((x1 & 1) == 0 && (y1 & 1) == 0) {
        ++p2;
        x1 >>= 1;
        y1 >>= 1;
    }

    int64_t t;
    if ((x1 & 1) == 1) {
        t = -y1;
    } else {
        t = x1;
    }

    while (t != 0) {
        while ((t & 1) == 0) {
            t = t >> 1;
        }
        if (t > 0) {
            x1 = t;
        } else {
            y1 = -t;
        }
        t = x1 - y1;
    }

    int64_t gcd = x1 << p2;

    // x * y == gcd(x, y) * lcm(x, y)
    return x / gcd * y;
}